

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

YV12_BUFFER_CONFIG * av1_get_scaled_ref_frame(AV1_COMP *cpi,int ref_frame)

{
  RefCntBuffer *pRVar1;
  long lVar2;
  YV12_BUFFER_CONFIG *pYVar3;
  RefCntBuffer *pRVar4;
  
  pRVar1 = cpi->scaled_ref_buf[(long)ref_frame + -1];
  if (((byte)((char)ref_frame - 1U) < 8) &&
     (lVar2 = (long)(cpi->common).remapped_ref_idx[(ref_frame & 0xffU) - 1], lVar2 != -1)) {
    pRVar4 = (cpi->common).ref_frame_map[lVar2];
  }
  else {
    pRVar4 = (RefCntBuffer *)0x0;
  }
  pYVar3 = (YV12_BUFFER_CONFIG *)0x0;
  if (pRVar1 != pRVar4) {
    pYVar3 = &pRVar1->buf;
  }
  if (pRVar1 == (RefCntBuffer *)0x0) {
    pYVar3 = (YV12_BUFFER_CONFIG *)0x0;
  }
  return pYVar3;
}

Assistant:

YV12_BUFFER_CONFIG *av1_get_scaled_ref_frame(const AV1_COMP *cpi,
                                             int ref_frame) {
  assert(ref_frame >= LAST_FRAME && ref_frame <= ALTREF_FRAME);
  RefCntBuffer *const scaled_buf = cpi->scaled_ref_buf[ref_frame - 1];
  const RefCntBuffer *const ref_buf =
      get_ref_frame_buf(&cpi->common, ref_frame);
  return (scaled_buf != ref_buf && scaled_buf != NULL) ? &scaled_buf->buf
                                                       : NULL;
}